

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O1

void __thiscall cppforth::Forth::dataFloat(Forth *this,FCell x)

{
  CAddr CVar1;
  Cell i;
  long lVar2;
  FCell local_20;
  
  local_20 = x;
  checkValidHere(this,"F,");
  requireDataSpaceAvailable(this,(long)this->FCellSize,"F,");
  CVar1 = this->dataPointer;
  lVar2 = 0;
  do {
    dataSpaceSet(this,CVar1 + (int)lVar2,*(Char *)((long)&local_20 + lVar2));
    lVar2 = lVar2 + 1;
  } while (lVar2 != 8);
  this->dataPointer = this->dataPointer + this->FCellSize;
  return;
}

Assistant:

void dataFloat(FCell x) {
			REQUIRE_VALID_HERE("F,");
			REQUIRE_DATASPACE_AVAILABLE(FCellSize, "F,");
			REQUIRE_ALIGNED(getDataPointer(), "F,");
			setDataCell((AADDR(getDataPointer())), x);
			incDataPointer(FCellSize);
		}